

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O0

int64_t duckdb::DateSub::YearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
                  (dtime_t startdate,dtime_t enddate)

{
  NotImplementedException *this;
  allocator local_31;
  string local_30 [48];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"\"time\" units \"year\" not recognized",&local_31);
  duckdb::NotImplementedException::NotImplementedException(this,local_30);
  __cxa_throw(this,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

int64_t DateSub::YearOperator::Operation(dtime_t startdate, dtime_t enddate) {
	throw NotImplementedException("\"time\" units \"year\" not recognized");
}